

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplifyMathematicalExpressions.cpp
# Opt level: O2

bool isOperator(string *input)

{
  bool bVar1;
  bool bVar2;
  
  if (input->_M_string_length < 2) {
    bVar1 = std::operator<=(input,"a");
    if (!bVar1) {
      bVar1 = std::operator>=(input,"z");
      if (!bVar1) goto LAB_00136f8e;
    }
    bVar1 = std::operator<=(input,"A");
    if (!bVar1) {
      bVar1 = std::operator>=(input,"Z");
      if (!bVar1) goto LAB_00136f8e;
    }
    bVar2 = std::operator<=(input,"0");
    bVar1 = true;
    if (!bVar2) {
      bVar1 = std::operator>=(input,"9");
      return bVar1;
    }
  }
  else {
LAB_00136f8e:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isOperator(std::string input){
    if(input.size() > 1){
        return false;
    }
    return (input <= "a" || input >= "z") && (input <= "A" || input >= "Z") && (input <= "0" || input >= "9");
}